

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell-interface.h
# Opt level: O0

void __thiscall
wasm::ShellExternalInterface::store128
          (ShellExternalInterface *this,Address addr,array<unsigned_char,_16UL> *value,
          Name memoryName)

{
  bool bVar1;
  pointer ppVar2;
  address64_t address;
  Memory *memory;
  _Self local_38;
  iterator it;
  array<unsigned_char,_16UL> *value_local;
  ShellExternalInterface *this_local;
  Name memoryName_local;
  Address addr_local;
  
  memoryName_local.super_IString.str._M_len = memoryName.super_IString.str._M_str;
  this_local = memoryName.super_IString.str._M_len;
  it._M_node = (_Base_ptr)value;
  memoryName_local.super_IString.str._M_str = (char *)addr.addr;
  local_38._M_node =
       (_Base_ptr)
       std::
       map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
       ::find(&this->memories,(key_type *)&this_local);
  memory = (Memory *)
           std::
           map<wasm::Name,_wasm::ShellExternalInterface::Memory,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>_>
           ::end(&this->memories);
  bVar1 = std::operator!=(&local_38,(_Self *)&memory);
  if (!bVar1) {
    __assert_fail("it != memories.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/shell-interface.h"
                  ,0x119,
                  "virtual void wasm::ShellExternalInterface::store128(Address, const std::array<uint8_t, 16> &, Name)"
                 );
  }
  ppVar2 = std::
           _Rb_tree_iterator<std::pair<const_wasm::Name,_wasm::ShellExternalInterface::Memory>_>::
           operator->(&local_38);
  address = Address::operator_cast_to_unsigned_long
                      ((Address *)&memoryName_local.super_IString.str._M_str);
  Memory::set<std::array<unsigned_char,16ul>>
            (&ppVar2->second,address,(array<unsigned_char,_16UL>)*(_Type *)it._M_node);
  return;
}

Assistant:

void store128(Address addr,
                const std::array<uint8_t, 16>& value,
                Name memoryName) override {
    auto it = memories.find(memoryName);
    assert(it != memories.end());
    auto& memory = it->second;
    memory.set<std::array<uint8_t, 16>>(addr, value);
  }